

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O2

void __thiscall dd::TaskQueueStdlib::Delete(TaskQueueStdlib *this)

{
  TaskQueueStdlib *pTVar1;
  
  pTVar1 = (TaskQueueStdlib *)TaskQueueBase::Current();
  if (pTVar1 != this) {
    pthread_mutex_lock((pthread_mutex_t *)&this->_pending_lock);
    this->_thread_should_quit = true;
    pthread_mutex_unlock((pthread_mutex_t *)&this->_pending_lock);
    Event::Set(&this->_flag_notify);
    Event::Wait(&this->_stopped,-1);
    PlatformThread::Stop(&this->_thread);
    ~TaskQueueStdlib(this);
    operator_delete(this,0x2b8);
    return;
  }
  __assert_fail("!IsCurrent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/linux/task_queue_stdlib.cc"
                ,0x56,"virtual void dd::TaskQueueStdlib::Delete()");
}

Assistant:

void TaskQueueStdlib::Delete()
	{
		assert(!IsCurrent());
		{
			AutoLock lock_(_pending_lock);
			_thread_should_quit = true;
		}
		NotifyWake();
		_stopped.Wait(-1);
		_thread.Stop();
		delete this;
	}